

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

uint * Cec_ManSimSimDeref(Cec_ManSim_t *p,int i)

{
  uint *puVar1;
  int *piVar2;
  
  piVar2 = p->pSimInfo;
  if ((long)piVar2[i] < 1) {
    __assert_fail("p->pSimInfo[i] > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x1bc,"unsigned int *Cec_ManSimSimDeref(Cec_ManSim_t *, int)");
  }
  puVar1 = p->pMems + piVar2[i];
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return puVar1;
  }
  *puVar1 = p->MemFree;
  p->MemFree = piVar2[i];
  piVar2[i] = 0;
  p->nMems = p->nMems + -1;
  return puVar1;
}

Assistant:

unsigned * Cec_ManSimSimDeref( Cec_ManSim_t * p, int i )
{
    unsigned * pSim;
    assert( p->pSimInfo[i] > 0 );
    pSim = p->pMems + p->pSimInfo[i];
    if ( --pSim[0] == 0 )
    {
        pSim[0] = p->MemFree;
        p->MemFree = p->pSimInfo[i];
        p->pSimInfo[i] = 0;
        p->nMems--;
    }
    return pSim;
}